

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int __thiscall CVmObjString::equals(CVmObjString *this,vm_obj_id_t self,vm_val_t *val,int param_4)

{
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if ((in_RDX->typ == VM_OBJ) && ((in_RDX->val).obj == in_ESI)) {
    local_4 = 1;
  }
  else {
    local_4 = const_equals((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
  }
  return local_4;
}

Assistant:

int CVmObjString::equals(VMG_ vm_obj_id_t self,
                         const vm_val_t *val, int /*depth*/) const
{
    /* if the other value is a reference to myself, we certainly match */
    if (val->typ == VM_OBJ && val->val.obj == self)
        return TRUE;

    /* 
     *   use the constant string comparison routine, using our underlying
     *   string as the constant string data 
     */
    return const_equals(vmg_ ext_, val);
}